

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

bool llama_state_load_file
               (llama_context *ctx,char *path_session,llama_token *tokens_out,
               size_t n_token_capacity,size_t *n_token_count_out)

{
  bool bVar1;
  
  llama_context::synchronize(ctx);
  bVar1 = llama_context::state_load_file
                    (ctx,path_session,tokens_out,n_token_capacity,n_token_count_out);
  return bVar1;
}

Assistant:

bool llama_state_load_file(llama_context * ctx, const char * path_session, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    ctx->synchronize();

    try {
        return ctx->state_load_file(path_session, tokens_out, n_token_capacity, n_token_count_out);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error loading session file: %s\n", __func__, err.what());
        return false;
    }
}